

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_fclose(Context *context,IntrinsicResult partialResult)

{
  ListStorage<MiniScript::TACLine> *pLVar1;
  anon_union_8_3_2f476f46_for_data aVar2;
  long *plVar3;
  undefined4 *puVar4;
  Value fileWrapper;
  Value self;
  Value local_88;
  Value local_78;
  ValueType local_68;
  undefined2 local_67;
  anon_union_8_3_2f476f46_for_data local_60;
  Value local_58;
  long *local_48;
  char local_40;
  undefined1 local_38 [32];
  
  local_40 = '\0';
  plVar3 = (long *)operator_new(0x30);
  plVar3[1] = 1;
  *plVar3 = (long)&PTR__StringStorage_001bf0d8;
  plVar3[3] = 5;
  plVar3[4] = -1;
  puVar4 = (undefined4 *)operator_new__(5);
  plVar3[2] = (long)puVar4;
  *(undefined1 *)(puVar4 + 1) = 0;
  *puVar4 = 0x666c6573;
  local_48 = plVar3;
  MiniScript::Context::GetVar
            ((Context *)local_38,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  if ((local_48 != (long *)0x0) && (local_40 == '\0')) {
    plVar3 = local_48 + 1;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
  }
  local_68 = _handle.type;
  local_67._0_1_ = _handle.noInvoke;
  local_67._1_1_ = _handle.localOnly;
  local_60 = _handle.data;
  if (_handle.data.ref != (RefCountedStorage *)0x0 && Temp < _handle.type) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_58,(Value *)local_38);
  if ((Temp < local_68) && (local_60.ref != (RefCountedStorage *)0x0)) {
    plVar3 = &(local_60.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_60.ref)->_vptr_RefCountedStorage[1])();
    }
    local_60.number = 0.0;
  }
  aVar2 = local_58.data;
  if (local_58.type == Handle) {
    if ((FILE *)local_58.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      local_78.type = MiniScript::Value::zero;
      local_78.noInvoke = DAT_001c12e1;
      local_78.localOnly = DAT_001c12e2;
      local_78.data.ref = DAT_001c12e8;
      if (DAT_001c12e8 != (RefCountedStorage *)0x0 && Temp < MiniScript::Value::zero) {
        DAT_001c12e8->refCount = DAT_001c12e8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_78);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_78.type) && (local_78.data.ref != (RefCountedStorage *)0x0)) {
        plVar3 = &(local_78.data.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_78.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_78.data.number = 0.0;
      }
    }
    else {
      fclose((FILE *)local_58.data.ref[1]._vptr_RefCountedStorage);
      aVar2.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
      local_88.type = MiniScript::Value::one;
      local_88.noInvoke = DAT_001c12f1;
      local_88.localOnly = DAT_001c12f2;
      local_88.data.ref = DAT_001c12f8;
      if (DAT_001c12f8 != (RefCountedStorage *)0x0 && Temp < MiniScript::Value::one) {
        DAT_001c12f8->refCount = DAT_001c12f8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_88);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_88.type) && (local_88.data.ref != (RefCountedStorage *)0x0)) {
        plVar3 = &(local_88.data.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_88.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_88.data.number = 0.0;
      }
    }
  }
  else {
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    pLVar1 = MiniScript::IntrinsicResult::Null;
    (context->code).ls = MiniScript::IntrinsicResult::Null;
    if (pLVar1 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar3 = &(pLVar1->super_RefCountedStorage).refCount;
      *plVar3 = *plVar3 + 1;
    }
  }
  if ((Temp < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
    plVar3 = &(local_58.data.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if ((Temp < local_38[0]) && ((RefCountedStorage *)local_38._8_8_ != (RefCountedStorage *)0x0)) {
    plVar3 = (long *)(local_38._8_8_ + 8);
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(*(_func_int ***)local_38._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fclose(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);
	fclose(handle);
	storage->f = nullptr;
	return IntrinsicResult(Value::one);
}